

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataViewDefault.cpp
# Opt level: O2

bool __thiscall Rml::DataViewAttributeIf::Update(DataViewAttributeIf *this,DataModel *model)

{
  bool bVar1;
  Element *element;
  DataExpression *this_00;
  Variant *pVVar2;
  String *name;
  bool bVar3;
  Variant variant;
  DataExpressionInterface expr_interface;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  Variant local_60;
  DataExpressionInterface local_38;
  
  Variant::Variant(&local_60);
  element = DataView::GetElement((DataView *)this);
  DataExpressionInterface::DataExpressionInterface(&local_38,model,element,(Event *)0x0);
  if (element != (Element *)0x0) {
    this_00 = DataViewCommon::GetExpression(&this->super_DataViewCommon);
    bVar1 = DataExpression::Run(this_00,&local_38,&local_60);
    if (bVar1) {
      bVar1 = Variant::Get<bool>(&local_60,false);
      name = &(this->super_DataViewCommon).modifier;
      pVVar2 = Element::GetAttribute(element,name);
      bVar3 = (pVVar2 == (Variant *)0x0) == bVar1;
      if (bVar3) {
        if (bVar1) {
          local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
          local_80._M_string_length = 0;
          local_80.field_2._M_local_buf[0] = '\0';
          Element::SetAttribute<std::__cxx11::string>(element,name,&local_80);
          ::std::__cxx11::string::~string((string *)&local_80);
        }
        else {
          Element::RemoveAttribute(element,name);
        }
      }
      goto LAB_0026e659;
    }
  }
  bVar3 = false;
LAB_0026e659:
  Variant::~Variant(&local_60);
  return bVar3;
}

Assistant:

bool DataViewAttributeIf::Update(DataModel& model)
{
	const String& attribute_name = GetModifier();
	bool result = false;
	Variant variant;
	Element* element = GetElement();
	DataExpressionInterface expr_interface(&model, element);

	if (element && GetExpression().Run(expr_interface, variant))
	{
		const bool value = variant.Get<bool>();
		const bool is_set = static_cast<bool>(element->GetAttribute(attribute_name));
		if (is_set != value)
		{
			if (value)
				element->SetAttribute(attribute_name, String());
			else
				element->RemoveAttribute(attribute_name);
			result = true;
		}
	}
	return result;
}